

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecCorr.c
# Opt level: O1

void Cec_ManPrintFlopEquivs(Gia_Man_t *p)

{
  int iVar1;
  Gia_Obj_t *pGVar2;
  undefined8 uVar3;
  Vec_Ptr_t *pVVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  long lVar8;
  ulong uVar9;
  Gia_Obj_t *pGVar10;
  uint uVar11;
  
  if (p->vNamesIn == (Vec_Ptr_t *)0x0) {
    __assert_fail("p->vNamesIn != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/cec/cecCorr.c"
                  ,0x45d,"void Cec_ManPrintFlopEquivs(Gia_Man_t *)");
  }
  iVar5 = p->nRegs;
  if (0 < iVar5) {
    iVar7 = 0;
    do {
      iVar1 = p->vCis->nSize;
      uVar6 = (iVar1 - iVar5) + iVar7;
      if (((int)uVar6 < 0) || (iVar1 <= (int)uVar6)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar5 = p->vCis->pArray[uVar6];
      lVar8 = (long)iVar5;
      if (lVar8 < 0) {
LAB_005ca50b:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                      ,0x1af,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      iVar1 = p->nObjs;
      if (iVar1 <= iVar5) goto LAB_005ca50b;
      pGVar2 = p->pObjs;
      if (pGVar2 == (Gia_Obj_t *)0x0) {
        return;
      }
      uVar9 = (ulong)(uint)p->pReprs[lVar8] & 0xfffffff;
      if (uVar9 == 0xfffffff) {
        pGVar10 = (Gia_Obj_t *)0x0;
LAB_005ca41b:
        if (pGVar10 != (Gia_Obj_t *)0x0) {
          pVVar4 = p->vNamesIn;
          uVar3 = *(undefined8 *)(pGVar2 + lVar8);
          iVar5 = (int)uVar3;
          uVar6 = (uint)((ulong)uVar3 >> 0x20);
          if ((~(uint)*(undefined8 *)pGVar10 & 0x9fffffff) == 0) {
            if (-1 < iVar5) {
LAB_005ca568:
              __assert_fail("pObj->fTerm",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                            ,0x1b8,"int Gia_ObjCioId(Gia_Obj_t *)");
            }
            if ((pVVar4->nSize <= (int)(uVar6 & 0x1fffffff)) ||
               (uVar11 = (uint)((ulong)*(undefined8 *)pGVar10 >> 0x20),
               pVVar4->nSize <= (int)(uVar11 & 0x1fffffff))) {
LAB_005ca549:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                            ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
            }
            Abc_Print((int)pVVar4,"Original flop %s is proved equivalent to flop %s.\n",
                      *(undefined8 *)((long)pVVar4->pArray + (ulong)(uVar6 << 3)),
                      *(undefined8 *)((long)pVVar4->pArray + (ulong)(uVar11 << 3)));
          }
          else {
            if (-1 < iVar5) goto LAB_005ca568;
            if (pVVar4->nSize <= (int)(uVar6 & 0x1fffffff)) goto LAB_005ca549;
            if ((pGVar10 < pGVar2) || (pGVar2 + iVar1 <= pGVar10)) {
              __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                            ,0x1b7,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
            }
            Abc_Print((int)pVVar4,"Original flop %s is proved equivalent to internal node %d.\n",
                      *(undefined8 *)((long)pVVar4->pArray + (ulong)(uVar6 << 3)),
                      (ulong)(uint)((int)((ulong)((long)pGVar10 - (long)pGVar2) >> 2) * -0x55555555)
                     );
          }
        }
      }
      else {
        if ((int)uVar9 != 0) {
          if (iVar1 <= (int)uVar9) goto LAB_005ca50b;
          pGVar10 = pGVar2 + uVar9;
          goto LAB_005ca41b;
        }
        uVar3 = *(undefined8 *)(pGVar2 + lVar8);
        if (-1 < (int)uVar3) goto LAB_005ca568;
        uVar6 = (uint)((ulong)uVar3 >> 0x20);
        if (p->vNamesIn->nSize <= (int)(uVar6 & 0x1fffffff)) goto LAB_005ca549;
        Abc_Print((int)p->pReprs,"Original flop %s is proved equivalent to constant.\n",
                  *(undefined8 *)((long)p->vNamesIn->pArray + (ulong)(uVar6 << 3)));
      }
      iVar7 = iVar7 + 1;
      iVar5 = p->nRegs;
    } while (iVar7 < iVar5);
  }
  return;
}

Assistant:

void Cec_ManPrintFlopEquivs( Gia_Man_t * p )
{
    Gia_Obj_t * pObj, * pRepr;
    int i;
    assert( p->vNamesIn != NULL );
    Gia_ManForEachRo( p, pObj, i )
    {
        if ( Gia_ObjIsConst(p, Gia_ObjId(p, pObj)) )
            Abc_Print( 1, "Original flop %s is proved equivalent to constant.\n", Vec_PtrEntry(p->vNamesIn, Gia_ObjCioId(pObj)) );
        else if ( (pRepr = Gia_ObjReprObj(p, Gia_ObjId(p, pObj))) )
        {
            if ( Gia_ObjIsCi(pRepr) )
                Abc_Print( 1, "Original flop %s is proved equivalent to flop %s.\n",
                    Vec_PtrEntry( p->vNamesIn, Gia_ObjCioId(pObj)  ),
                    Vec_PtrEntry( p->vNamesIn, Gia_ObjCioId(pRepr) ) );
            else
                Abc_Print( 1, "Original flop %s is proved equivalent to internal node %d.\n",
                    Vec_PtrEntry( p->vNamesIn, Gia_ObjCioId(pObj) ), Gia_ObjId(p, pRepr) );
        }
    }
}